

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

bool __thiscall
soul::heart::Parser::parseTerminator
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  Type *requiredType;
  bool bVar1;
  Identifier IVar2;
  Block *pBVar3;
  Expression *pEVar4;
  Block *falseBranch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> destArgs;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> falseBranchArgs;
  undefined1 local_e8 [56];
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> local_b0;
  pool_ptr<soul::heart::Block> local_78;
  pool_ptr<soul::heart::Block> local_70;
  CompileMessage local_68;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"branch");
  if (bVar1) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    IVar2 = parseBlockName(this);
    pBVar3 = getBlock(this,state,IVar2);
    parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_e8,this
               ,state);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27ca5c);
    local_70.object = (Block *)0x0;
    FunctionBuilder::addBranch(builder,pBVar3,(ArgListType *)local_e8,&local_70);
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,"branch_if");
    if (!bVar1) {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,"return");
      if (!bVar1) {
        return false;
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x27ca5c);
      requiredType = &state->function->returnType;
      if (bVar1) {
        if ((requiredType->category != invalid) &&
           ((state->function->returnType).primitiveType.type != void_)) {
          local_b0.items = (pool_ref<soul::heart::Expression> *)(this->module).object;
          Program::ProgramImpl::getTypeDescriptionWithQualificationIfNeeded_abi_cxx11_
                    ((string *)local_e8,(this->program).pimpl,
                     (pool_ptr<const_soul::Module> *)&local_b0,requiredType);
          CompileMessageHelpers::createMessage<std::__cxx11::string>
                    (&local_68,(CompileMessageHelpers *)0x1,none,0x2a2f0d,(char *)local_e8,in_R9);
          CodeLocation::throwError
                    (&(this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ).location,&local_68);
        }
        FunctionBuilder::addReturn(builder);
        return true;
      }
      pEVar4 = parseExpression(this,state,requiredType);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x27ca5c);
      FunctionBuilder::addReturn(builder,pEVar4);
      return true;
    }
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    local_e8._0_8_ = (pool_ref<soul::heart::Expression> *)0x900000001;
    local_e8._8_8_ = 0;
    local_e8._16_8_ = (Structure *)0x0;
    pEVar4 = parseExpression(this,state,(Type *)local_e8);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_e8._16_8_);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27ca88);
    IVar2 = parseBlockName(this);
    pBVar3 = getBlock(this,state,IVar2);
    parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)local_e8,this
               ,state);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2a4983);
    IVar2 = parseBlockName(this);
    falseBranch = getBlock(this,state,IVar2);
    parseOptionalBranchArgs<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>>
              (&local_b0,this,state);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27ca5c);
    local_78.object = (Block *)0x0;
    FunctionBuilder::addBranchIf
              (builder,pEVar4,pBVar3,(ArgListType *)local_e8,falseBranch,&local_b0,&local_78);
    local_b0.numActive = 0;
    if ((4 < local_b0.numAllocated) && (local_b0.items != (pool_ref<soul::heart::Expression> *)0x0))
    {
      operator_delete__(local_b0.items);
    }
  }
  local_e8._8_8_ = 0;
  if (((Structure *)0x4 < (ulong)local_e8._16_8_) &&
     ((pool_ref<soul::heart::Expression> *)local_e8._0_8_ !=
      (pool_ref<soul::heart::Expression> *)0x0)) {
    operator_delete__((void *)local_e8._0_8_);
  }
  return true;
}

Assistant:

bool parseTerminator (FunctionParseState& state, FunctionBuilder& builder)
    {
        if (matchIf ("branch"))
        {
            auto& dest = parseBlockNameAndFind (state);
            auto destArgs = parseOptionalBranchArgs<heart::Branch::ArgListType> (state);
            expectSemicolon();
            builder.addBranch (dest, std::move (destArgs), {});
            return true;
        }

        if (matchIf ("branch_if"))
        {
            auto& condition = parseExpression (state, PrimitiveType::bool_);
            expect (HEARTOperator::question);
            auto& trueBranch = parseBlockNameAndFind (state);
            auto trueBranchArgs = parseOptionalBranchArgs<heart::BranchIf::ArgListType> (state);
            expect (HEARTOperator::colon);
            auto& falseBranch = parseBlockNameAndFind (state);
            auto falseBranchArgs = parseOptionalBranchArgs<heart::BranchIf::ArgListType> (state);
            expectSemicolon();
            builder.addBranchIf (condition, trueBranch, std::move (trueBranchArgs), falseBranch, std::move (falseBranchArgs), {});
            return true;
        }

        if (matchIf ("return"))
        {
            if (matchIf (HEARTOperator::semicolon))
            {
                if (state.function.returnType.isValid() && (! state.function.returnType.isVoid()))
                    location.throwError (Errors::expectedExpressionOfType (getTypeDescription (state.function.returnType)));

                builder.addReturn();
                return true;
            }

            auto& value = parseExpression (state, state.function.returnType);
            expectSemicolon();
            builder.addReturn (value);
            return true;
        }

        return false;
    }